

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.h
# Opt level: O0

int JS_VALUE_IS_NAN(JSValue v)

{
  anon_union_8_2_f9ece1b0 u;
  JSValue v_local;
  undefined4 local_4;
  
  if (v.tag == 7) {
    local_4 = (uint)(0x7ff0000000000000 < ((ulong)v.u.ptr & 0x7fffffffffffffff));
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline JS_BOOL JS_VALUE_IS_NAN(JSValue v)
{
    union {
        double d;
        uint64_t u64;
    } u;
    if (v.tag != JS_TAG_FLOAT64)
        return 0;
    u.d = v.u.float64;
    return (u.u64 & 0x7fffffffffffffff) > 0x7ff0000000000000;
}